

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

HighsStatus
ipxBasicSolutionToHighsBasicSolution
          (HighsLogOptions *log_options,HighsLp *lp,vector<double,_std::allocator<double>_> *rhs,
          vector<char,_std::allocator<char>_> *constraint_type,IpxSolution *ipx_solution,
          HighsBasis *highs_basis,HighsSolution *highs_solution)

{
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  vector<double,_std::allocator<double>_> *this_04;
  double dVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  bool bVar10;
  HighsBasisStatus HVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  HighsStatus HVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  uint local_bc;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  vector<double,_std::allocator<double>_> row_activity;
  value_type_conflict1 local_38;
  
  this_01 = &highs_solution->col_value;
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)lp->num_col_);
  this_02 = &highs_solution->row_value;
  std::vector<double,_std::allocator<double>_>::resize(this_02,(long)lp->num_row_);
  this_03 = &highs_solution->col_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_03,(long)lp->num_col_);
  this_04 = &highs_solution->row_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_04,(long)lp->num_row_);
  this = &highs_basis->col_status;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(this,(long)lp->num_col_);
  this_00 = &highs_basis->row_status;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (this_00,(long)lp->num_row_);
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar3 = ipx_solution->num_row;
  iVar4 = lp->num_row_;
  if (iVar3 < iVar4) {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&row_activity,(long)iVar4,&local_38);
  }
  bVar15 = 0 < lp->num_col_;
  if (0 < lp->num_col_) {
    uVar17 = 0;
    do {
      switch((ipx_solution->ipx_col_status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17]) {
      case 0:
        (this->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar17] = kBasic;
        (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar17] =
             (ipx_solution->ipx_col_value).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar17];
        dVar19 = 0.0;
        goto LAB_0025a4ba;
      case -3:
        (this->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar17] = kZero;
        break;
      case -2:
        (this->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar17] = kUpper;
        break;
      case -1:
        (this->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar17] = kLower;
        break;
      default:
        bVar10 = true;
        highsLogDev(log_options,kError,
                    "\nError in IPX conversion: Unrecognised value ipx_col_status[%2d] = %d\n");
        goto LAB_0025a4cb;
      }
      (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar17] =
           (ipx_solution->ipx_col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start[uVar17];
      dVar19 = (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17];
LAB_0025a4ba:
      (this_03->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar17] = dVar19;
      bVar10 = false;
LAB_0025a4cb:
      if (bVar10) {
        highsLogDev(log_options,kError,"Bounds [%11.4g, %11.4g]\n",
                    (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar17],
                    (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar17]);
        highsLogDev(log_options,kError,
                    "Col %2d ipx_col_status[%2d] = %2d; x[%2d] = %11.4g; z[%2d] = %11.4g\n",
                    (ipx_solution->ipx_col_value).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar17],
                    (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17],uVar17 & 0xffffffff,
                    uVar17 & 0xffffffff,
                    (ulong)(uint)(ipx_solution->ipx_col_status).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar17],uVar17,uVar17);
        highsLogUser(log_options,kError,"Unrecognised ipx_col_status value from IPX\n");
      }
      else if (iVar3 < iVar4) {
        piVar7 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar7[uVar17];
        lVar14 = (long)iVar5;
        iVar6 = piVar7[uVar17 + 1];
        if (iVar5 < iVar6) {
          piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar5 = piVar7[lVar14];
            row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] =
                 pdVar8[uVar17] * pdVar9[lVar14] +
                 row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar5];
            lVar14 = lVar14 + 1;
          } while (iVar6 != lVar14);
        }
      }
      if (bVar10) break;
      uVar17 = uVar17 + 1;
      bVar15 = (long)uVar17 < (long)lp->num_col_;
    } while ((long)uVar17 < (long)lp->num_col_);
  }
  HVar16 = kError;
  if (!bVar15) {
    bVar15 = 0 < lp->num_row_;
    if (lp->num_row_ < 1) {
      local_9c = 0;
      local_a0 = 0;
      local_a4 = 0;
    }
    else {
      local_bc = lp->num_col_;
      uVar17 = 0;
      local_a4 = 0;
      local_a0 = 0;
      local_9c = 0;
      uVar12 = 0;
      do {
        uVar18 = (ulong)uVar12;
        dVar19 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
        dVar20 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
        if ((-INFINITY < dVar19) || (dVar20 < INFINITY)) {
          if ((dVar19 == -INFINITY) || ((dVar20 == INFINITY || (dVar20 <= dVar19)))) {
            if ((ipx_solution->ipx_row_status).super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_start[(int)uVar12] == 0) {
              (this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar17] = kBasic;
              (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar17] =
                   (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar12] -
                   (ipx_solution->ipx_row_value).super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar12];
              (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar17] = 0.0;
LAB_0025a88c:
              bVar10 = false;
            }
            else {
              dVar19 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar12];
              dVar20 = (ipx_solution->ipx_row_value).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar12];
              dVar1 = (ipx_solution->ipx_row_dual).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar12];
              cVar2 = (constraint_type->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar12];
              if (cVar2 == '<') {
                (this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar17] = kUpper;
LAB_0025a870:
                (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar17] = dVar19 - dVar20;
                (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar17] = dVar1;
                goto LAB_0025a88c;
              }
              if (cVar2 == '=') {
                (this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar17] = (dVar1 < 0.0) * '\x02';
                goto LAB_0025a870;
              }
              if (cVar2 == '>') {
                (this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar17] = kLower;
                goto LAB_0025a870;
              }
              bVar10 = true;
              highsLogDev(log_options,kError,
                          "Error in IPX conversion: Row %2d: cannot handle constraint_type[%2d] = %d\n"
                          ,uVar17 & 0xffffffff,uVar18,(ulong)(uint)(int)cVar2);
            }
          }
          else {
            lVar14 = (long)(int)local_bc;
            dVar19 = (ipx_solution->ipx_col_value).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            if ((ipx_solution->ipx_row_status).super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_start[(int)uVar12] == 0) {
              local_a0 = local_a0 + 1;
LAB_0025a77a:
              dVar20 = 0.0;
              HVar11 = kBasic;
LAB_0025a7ce:
              (this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar17] = HVar11;
              (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar17] = dVar19;
              (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar17] = dVar20;
              bVar10 = false;
            }
            else {
              dVar20 = (ipx_solution->ipx_col_dual).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
              uVar13 = (ipx_solution->ipx_col_status).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14];
              if (uVar13 == 0xfffffffe) {
                HVar11 = kUpper;
                goto LAB_0025a7ce;
              }
              if (uVar13 == 0xffffffff) {
                HVar11 = kLower;
                goto LAB_0025a7ce;
              }
              if (uVar13 == 0) {
                local_a4 = local_a4 + 1;
                goto LAB_0025a77a;
              }
              bVar10 = true;
              highsLogDev(log_options,kError,
                          "Error in IPX conversion: Row %2d (IPX row %2d) has unrecognised value ipx_col_status[%2d] = %d\n"
                          ,uVar17 & 0xffffffff,uVar18,(ulong)local_bc,(ulong)uVar13);
            }
            local_9c = local_9c + 1;
            local_bc = local_bc + 1;
          }
          uVar13 = uVar12 + 1;
        }
        else {
          (this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl
          .super__Vector_impl_data._M_start[uVar17] = kBasic;
          (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar17] =
               row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
          (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar17] = 0.0;
          bVar10 = false;
          uVar13 = uVar12;
        }
        if (bVar10) {
          highsLogDev(log_options,kError,"Bounds [%11.4g, %11.4g]\n",
                      (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17],
                      (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17]);
          highsLogDev(log_options,kError,
                      "Row %2d ipx_row_status[%2d] = %2d; s[%2d] = %11.4g; y[%2d] = %11.4g\n",
                      (ipx_solution->ipx_row_value).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar12],
                      (ipx_solution->ipx_row_dual).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar12],uVar17 & 0xffffffff,uVar18,
                      (ulong)(uint)(ipx_solution->ipx_row_status).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)uVar12],uVar18,uVar18);
          highsLogUser(log_options,kError,"Unrecognised ipx_row_status value from IPX\n");
          if (bVar10) break;
        }
        uVar17 = uVar17 + 1;
        bVar15 = (long)uVar17 < (long)lp->num_row_;
        uVar12 = uVar13;
      } while ((long)uVar17 < (long)lp->num_row_);
    }
    HVar16 = kError;
    if (!bVar15) {
      if (lp->sense_ == kMaximize) {
        iVar3 = lp->num_col_;
        if (0 < (long)iVar3) {
          pdVar9 = (this_03->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar14 = 0;
          do {
            pdVar9[lVar14] = -pdVar9[lVar14];
            lVar14 = lVar14 + 1;
          } while (iVar3 != lVar14);
        }
        iVar3 = lp->num_row_;
        if (0 < (long)iVar3) {
          pdVar9 = (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar14 = 0;
          do {
            pdVar9[lVar14] = -pdVar9[lVar14];
            lVar14 = lVar14 + 1;
          } while (iVar3 != lVar14);
        }
      }
      if (local_9c != 0) {
        highsLogDev(log_options,kInfo,"Of %d boxed rows: %d are basic and %d have basic slacks\n",
                    (ulong)local_9c,(ulong)local_a0,(ulong)local_a4);
      }
      highs_solution->value_valid = true;
      highs_solution->dual_valid = true;
      highs_basis->valid = true;
      highs_basis->useful = true;
      HVar16 = kOk;
    }
  }
  if (row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar16;
}

Assistant:

HighsStatus ipxBasicSolutionToHighsBasicSolution(
    const HighsLogOptions& log_options, const HighsLp& lp,
    const std::vector<double>& rhs, const std::vector<char>& constraint_type,
    const IpxSolution& ipx_solution, HighsBasis& highs_basis,
    HighsSolution& highs_solution) {
  // Resize the HighsSolution and HighsBasis
  highs_solution.col_value.resize(lp.num_col_);
  highs_solution.row_value.resize(lp.num_row_);
  highs_solution.col_dual.resize(lp.num_col_);
  highs_solution.row_dual.resize(lp.num_row_);
  highs_basis.col_status.resize(lp.num_col_);
  highs_basis.row_status.resize(lp.num_row_);

  const std::vector<double>& ipx_col_value = ipx_solution.ipx_col_value;
  const std::vector<double>& ipx_row_value = ipx_solution.ipx_row_value;
  const std::vector<double>& ipx_col_dual = ipx_solution.ipx_col_dual;
  const std::vector<double>& ipx_row_dual = ipx_solution.ipx_row_dual;
  const std::vector<ipx::Int>& ipx_col_status = ipx_solution.ipx_col_status;
  const std::vector<ipx::Int>& ipx_row_status = ipx_solution.ipx_row_status;

  // Set up meaningful names for values of ipx_col_status and ipx_row_status to
  // be used later in comparisons
  const ipx::Int ipx_basic = 0;
  const ipx::Int ipx_nonbasic_at_lb = -1;
  const ipx::Int ipx_nonbasic_at_ub = -2;
  const ipx::Int ipx_superbasic = -3;
  // Row activities are needed to set activity values of free rows -
  // which are ignored by IPX
  vector<double> row_activity;
  bool get_row_activities = ipx_solution.num_row < lp.num_row_;
  if (get_row_activities) row_activity.assign(lp.num_row_, 0);
  HighsInt num_basic_variables = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    bool unrecognised = false;
    if (ipx_col_status[col] == ipx_basic) {
      // Column is basic
      highs_basis.col_status[col] = HighsBasisStatus::kBasic;
      highs_solution.col_value[col] = ipx_col_value[col];
      highs_solution.col_dual[col] = 0;
    } else {
      // Column is nonbasic. Setting of ipx_col_status is consistent
      // with dual value for fixed columns
      if (ipx_col_status[col] == ipx_nonbasic_at_lb) {
        // Column is at lower bound
        highs_basis.col_status[col] = HighsBasisStatus::kLower;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_nonbasic_at_ub) {
        // Column is at upper bound
        highs_basis.col_status[col] = HighsBasisStatus::kUpper;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_superbasic) {
        // Column is superbasic
        highs_basis.col_status[col] = HighsBasisStatus::kZero;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else {
        unrecognised = true;
        highsLogDev(log_options, HighsLogType::kError,
                    "\nError in IPX conversion: Unrecognised value "
                    "ipx_col_status[%2" HIGHSINT_FORMAT
                    "] = "
                    "%" HIGHSINT_FORMAT "\n",
                    col, (HighsInt)ipx_col_status[col]);
      }
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.col_lower_[col],
                  lp.col_upper_[col]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Col %2" HIGHSINT_FORMAT " ipx_col_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; x[%2" HIGHSINT_FORMAT
                  "] = %11.4g; z[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  col, col, (HighsInt)ipx_col_status[col], col,
                  ipx_col_value[col], col, ipx_col_dual[col]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_col_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (get_row_activities) {
      // Accumulate row activities to assign value to free rows
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        row_activity[row] +=
            highs_solution.col_value[col] * lp.a_matrix_.value_[el];
      }
    }
    if (highs_basis.col_status[col] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  HighsInt ipx_row = 0;
  HighsInt ipx_slack = lp.num_col_;
  HighsInt num_boxed_rows = 0;
  HighsInt num_boxed_rows_basic = 0;
  HighsInt num_boxed_row_slacks_basic = 0;
  for (HighsInt row = 0; row < lp.num_row_; row++) {
    bool unrecognised = false;
    double lower = lp.row_lower_[row];
    double upper = lp.row_upper_[row];
    HighsInt this_ipx_row = ipx_row;
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free row - removed by IPX so make it basic at its row activity
      highs_basis.row_status[row] = HighsBasisStatus::kBasic;
      highs_solution.row_value[row] = row_activity[row];
      highs_solution.row_dual[row] = 0;
    } else {
      // Non-free row, so IPX will have it
      if ((lower > -kHighsInf && upper < kHighsInf) && (lower < upper)) {
        // Boxed row - look at its slack
        num_boxed_rows++;
        double slack_value = ipx_col_value[ipx_slack];
        double slack_dual = ipx_col_dual[ipx_slack];
        double value = slack_value;
        // @FlipRowDual -slack_dual became slack_dual
        double dual = slack_dual;
        if (ipx_row_status[ipx_row] == ipx_basic) {
          // Row is basic
          num_boxed_rows_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_basic) {
          // Slack is basic
          num_boxed_row_slacks_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_lb) {
          // Slack at lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub) {
          // Slack is at its upper bound
          assert(ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub);
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      " (IPX row %2" HIGHSINT_FORMAT
                      ") has "
                      "unrecognised value ipx_col_status[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, ipx_slack,
                      (HighsInt)ipx_col_status[ipx_slack]);
        }
        // Update the slack to be used for boxed rows
        ipx_slack++;
      } else if (ipx_row_status[ipx_row] == ipx_basic) {
        // Row is basic
        highs_basis.row_status[row] = HighsBasisStatus::kBasic;
        highs_solution.row_value[row] = rhs[ipx_row] - ipx_row_value[ipx_row];
        highs_solution.row_dual[row] = 0;
      } else {
        // Nonbasic row at fixed value, lower bound or upper bound
        assert(ipx_row_status[ipx_row] ==
               -1);  // const ipx::Int ipx_nonbasic_row = -1;
        double value = rhs[ipx_row] - ipx_row_value[ipx_row];
        // @FlipRowDual -ipx_row_dual[ipx_row]; became ipx_row_dual[ipx_row];
        double dual = ipx_row_dual[ipx_row];
        if (constraint_type[ipx_row] == '>') {
          // Row is at its lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '<') {
          // Row is at its upper bound
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '=') {
          // Row is at its fixed value: set HighsBasisStatus according
          // to sign of dual.
          //
          // Don't worry about maximization problems. IPX solves them
          // as minimizations with negated costs, so a negative dual
          // yields HighsBasisStatus::kUpper here, and dual signs are
          // then flipped below, so HighsBasisStatus::kUpper will have
          // corresponding positive dual.
          highs_basis.row_status[row] =
              dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      ": cannot handle "
                      "constraint_type[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, constraint_type[ipx_row]);
        }
      }
      // Update the IPX row index
      ipx_row++;
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.row_lower_[row],
                  lp.row_upper_[row]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Row %2" HIGHSINT_FORMAT " ipx_row_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; s[%2" HIGHSINT_FORMAT
                  "] = %11.4g; y[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  row, this_ipx_row, (HighsInt)ipx_row_status[this_ipx_row],
                  this_ipx_row, ipx_row_value[this_ipx_row], this_ipx_row,
                  ipx_row_dual[this_ipx_row]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_row_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (highs_basis.row_status[row] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  assert(num_basic_variables == lp.num_row_);
  assert(ipx_row == ipx_solution.num_row);
  assert(ipx_slack == ipx_solution.num_col);

  if (lp.sense_ == ObjSense::kMaximize) {
    // Flip dual values since original LP is maximization
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      highs_solution.col_dual[iCol] *= -1;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      highs_solution.row_dual[iRow] *= -1;
  }

  if (num_boxed_rows)
    highsLogDev(log_options, HighsLogType::kInfo,
                "Of %" HIGHSINT_FORMAT " boxed rows: %" HIGHSINT_FORMAT
                " are basic and %" HIGHSINT_FORMAT " have basic slacks\n",
                num_boxed_rows, num_boxed_rows_basic,
                num_boxed_row_slacks_basic);
  // Indicate that the primal solution, dual solution and basis are valid
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;
  highs_basis.valid = true;
  highs_basis.useful = true;
  return HighsStatus::kOk;
}